

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void parse_decode_block(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *r,
                       PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  aom_cdf_prob *paVar1;
  byte bVar2;
  uint8_t uVar3;
  BLOCK_SIZE BVar4;
  _Bool _Var5;
  _Bool _Var6;
  ushort uVar7;
  ushort uVar8;
  SequenceHeader *pSVar9;
  MB_MODE_INFO **ppMVar10;
  MB_MODE_INFO *mbmi_00;
  MB_MODE_INFO *pMVar11;
  FRAME_CONTEXT *pFVar12;
  bool bVar13;
  short sVar14;
  int16_t iVar15;
  int iVar16;
  uint plane_end;
  int *piVar17;
  byte bVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  ENTROPY_CONTEXT **ppEVar24;
  byte bVar25;
  uint uVar26;
  ENTROPY_CONTEXT (*paEVar27) [32];
  int j;
  uint uVar28;
  ulong uVar29;
  TX_SIZE TVar30;
  int idy;
  int iVar31;
  int iVar32;
  uint uVar33;
  int16_t *piVar34;
  int16_t *piVar35;
  int idx;
  int iVar36;
  aom_cdf_prob (*icdf) [4];
  undefined4 uVar37;
  undefined1 auVar38 [16];
  MB_MODE_INFO *mbmi;
  uint local_70;
  
  pSVar9 = (pbi->common).seq_params;
  uVar29 = (ulong)bsize;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar29];
  bVar18 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar29];
  uVar20 = (pbi->common).mi_params.mi_cols - mi_col;
  if ((int)(uint)bVar2 <= (int)uVar20) {
    uVar20 = (uint)bVar2;
  }
  uVar26 = (pbi->common).mi_params.mi_rows - mi_row;
  if ((int)(uint)bVar18 <= (int)uVar26) {
    uVar26 = (uint)bVar18;
  }
  uVar3 = pSVar9->monochrome;
  iVar32 = (pbi->common).mi_params.mi_stride;
  iVar16 = iVar32 * mi_row + mi_col;
  (pbi->common).mi_params.mi_grid_base[iVar16] =
       (pbi->common).mi_params.mi_alloc +
       ((mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [(pbi->common).mi_params.mi_alloc_bsize]) *
        (pbi->common).mi_params.mi_alloc_stride +
       mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [(pbi->common).mi_params.mi_alloc_bsize]);
  ppMVar10 = (pbi->common).mi_params.mi_grid_base + iVar16;
  (td->dcb).xd.mi = ppMVar10;
  (td->dcb).xd.tx_type_map = (pbi->common).mi_params.tx_type_map + iVar16;
  (td->dcb).xd.tx_type_map_stride = iVar32;
  (*ppMVar10)->bsize = bsize;
  if (1 < (int)uVar20) {
    uVar19 = 1;
    do {
      ppMVar10 = (td->dcb).xd.mi;
      ppMVar10[uVar19] = *ppMVar10;
      uVar19 = uVar19 + 1;
    } while (uVar20 != uVar19);
  }
  plane_end = (uint)(uVar3 == '\0') * 2 + 1;
  if (1 < (int)uVar26) {
    iVar16 = uVar26 - 1;
    do {
      ppMVar10 = (td->dcb).xd.mi;
      memcpy(ppMVar10 + iVar32,ppMVar10,(long)(int)uVar20 << 3);
      iVar32 = iVar32 + (pbi->common).mi_params.mi_stride;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  lVar21 = 0;
  do {
    bVar23 = (byte)((uint)bVar18 * 4 >>
                   (*(byte *)((long)(td->dcb).xd.plane[0].pre + lVar21 + -0x28) & 0x1f));
    bVar25 = (byte)((uint)bVar2 * 4 >>
                   (*(byte *)((long)(td->dcb).xd.plane[0].pre + lVar21 + -0x2c) & 0x1f));
    if (bVar25 < 5) {
      bVar25 = 4;
    }
    *(byte *)((long)((td->dcb).xd.plane[0].seg_iqmatrix + -1) + lVar21 + 0x90) = bVar25;
    if (bVar23 < 5) {
      bVar23 = 4;
    }
    *(byte *)((long)((td->dcb).xd.plane[0].seg_iqmatrix + -1) + lVar21 + 0x91) = bVar23;
    lVar21 = lVar21 + 0xa30;
  } while ((ulong)plane_end * 0xa30 - lVar21 != 0);
  ppMVar10 = (td->dcb).xd.mi;
  ppEVar24 = (td->dcb).xd.above_entropy_context;
  paEVar27 = (td->dcb).xd.left_entropy_context;
  lVar21 = 0;
  uVar33 = mi_row;
  iVar32 = mi_col;
  do {
    BVar4 = (*ppMVar10)->bsize;
    iVar16 = *(int *)((long)(td->dcb).xd.plane[0].pre + lVar21 * 8 + -0x2c);
    uVar28 = mi_row - 1;
    if ((0x20005UL >> (BVar4 & 0x3f) & 1) == 0) {
      uVar28 = uVar33;
    }
    iVar31 = *(int *)((long)(td->dcb).xd.plane[0].pre + lVar21 * 8 + -0x28);
    if (iVar31 == 0) {
      uVar28 = uVar33;
    }
    if ((mi_row & 1U) != 0) {
      uVar33 = uVar28;
    }
    iVar36 = mi_col + -1;
    if ((0x10003UL >> (BVar4 & 0x3f) & 1) == 0) {
      iVar36 = iVar32;
    }
    if (iVar16 == 0) {
      iVar36 = iVar32;
    }
    if ((mi_col & 1U) != 0) {
      iVar32 = iVar36;
    }
    *(ENTROPY_CONTEXT **)((td->dcb).xd.plane[0].seg_dequant_QTX + lVar21 * 2 + -4) =
         *ppEVar24 + (iVar32 >> ((byte)iVar16 & 0x1f));
    *(ENTROPY_CONTEXT **)((td->dcb).xd.plane[0].seg_dequant_QTX + lVar21 * 2 + -2) =
         *paEVar27 + ((uVar33 & 0x1f) >> ((byte)iVar31 & 0x1f));
    lVar21 = lVar21 + 0x146;
    paEVar27 = paEVar27 + 1;
    ppEVar24 = ppEVar24 + 1;
  } while ((ulong)plane_end * 0x146 - lVar21 != 0);
  set_mi_row_col((MACROBLOCKD *)td,(TileInfo *)(ulong)(uint)(td->dcb).xd.tile.mi_row_start,
                 (td->dcb).xd.tile.mi_col_start,mi_row,(uint)bVar18,mi_col,(uint)bVar2,
                 (pbi->common).mi_params.mi_rows);
  av1_setup_dst_planes
            ((td->dcb).xd.plane,bsize,&((pbi->common).cur_frame)->buf,mi_row,mi_col,0,plane_end);
  (*(td->dcb).xd.mi)->partition = partition;
  av1_read_mode_info(pbi,&td->dcb,r,uVar20,uVar26);
  if (BLOCK_8X4 < bsize) {
    if ((pSVar9->subsampling_x != 0 || pSVar9->subsampling_y != 0) &&
       (av1_ss_size_lookup[uVar29][pSVar9->subsampling_x][pSVar9->subsampling_y] == BLOCK_INVALID))
    {
      aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid block size.");
    }
  }
  av1_visit_palette(pbi,(MACROBLOCKD *)td,r,av1_decode_palette_tokens);
  uVar3 = ((pbi->common).seq_params)->monochrome;
  mbmi_00 = *(td->dcb).xd.mi;
  uVar7 = *(ushort *)&mbmi_00->field_0xa7;
  bVar13 = true;
  if (-1 < (char)uVar7) {
    bVar13 = '\0' < mbmi_00->ref_frame[0];
  }
  bVar23 = (pbi->common).features.tx_mode;
  if (((bsize == BLOCK_4X4 || (ulong)bVar23 != 2) || (!bVar13 || mbmi_00->skip_txfm != '\0')) ||
     ((td->dcb).xd.lossless[uVar7 & 7] != 0)) {
    BVar4 = mbmi_00->bsize;
    if (BVar4 == BLOCK_4X4 || (td->dcb).xd.lossless[uVar7 & 7] != 0) {
      uVar29 = 0;
    }
    else if ((bVar23 != 2) || (mbmi_00->skip_txfm != '\0' && bVar13)) {
      uVar29 = (ulong)""[BVar4];
      if (""[bVar23] < ""[uVar29]) {
        uVar29 = (ulong)""[bVar23];
      }
    }
    else {
      uVar19 = (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[BVar4];
      bVar2 = bsize_to_max_depth_bsize_to_max_depth_table[BVar4];
      uVar29 = (ulong)""[BVar4];
      uVar22 = (ulong)((uint)""[BVar4] * 4);
      _Var5 = (td->dcb).xd.up_available;
      _Var6 = (td->dcb).xd.left_available;
      bVar18 = *(td->dcb).xd.above_txfm_context;
      if ((_Var5 == true) &&
         ((pMVar11 = (td->dcb).xd.above_mbmi, (pMVar11->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar11->ref_frame[0])))) {
        bVar18 = block_size_wide[pMVar11->bsize];
      }
      bVar23 = *(td->dcb).xd.left_txfm_context;
      if ((_Var6 != false) &&
         ((pMVar11 = (td->dcb).xd.left_mbmi, (pMVar11->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar11->ref_frame[0])))) {
        bVar23 = block_size_high[pMVar11->bsize];
      }
      pFVar12 = (td->dcb).xd.tile_ctx;
      uVar20 = (uint)(byte)(_Var6 & *(int *)((long)tx_size_high + uVar22) <= (int)(uint)bVar23) +
               (uint)(byte)(_Var5 & *(int *)((long)tx_size_wide + uVar22) <= (int)(uint)bVar18);
      icdf = pFVar12->tx_size_cdf[uVar19 - 1] + uVar20;
      iVar32 = od_ec_decode_cdf_q15(&r->ec,*icdf,bVar2 + 1);
      if (r->allow_update_cdf != '\0') {
        uVar7 = pFVar12->tx_size_cdf[uVar19 - 1][uVar20][(ulong)bVar2 + 1];
        bVar18 = (char)(uVar7 >> 4) + 4;
        uVar22 = 0;
        do {
          uVar8 = (*icdf)[uVar22];
          if ((long)uVar22 < (long)(char)iVar32) {
            sVar14 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar18 & 0x1f));
          }
          else {
            sVar14 = -(uVar8 >> (bVar18 & 0x1f));
          }
          (*icdf)[uVar22] = sVar14 + uVar8;
          uVar22 = uVar22 + 1;
        } while ((uint)bVar2 + (uint)(bVar2 == 0) != uVar22);
        paVar1 = pFVar12->tx_size_cdf[uVar19 - 1][uVar20] + (ulong)bVar2 + 1;
        *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
      }
      if (0 < iVar32) {
        do {
          uVar29 = (ulong)""[uVar29];
          iVar32 = iVar32 + -1;
        } while (iVar32 != 0);
      }
    }
    TVar30 = (TX_SIZE)uVar29;
    mbmi_00->tx_size = TVar30;
    if (bVar13) {
      auVar38 = pshuflw(ZEXT216(CONCAT11(TVar30,TVar30)),ZEXT216(CONCAT11(TVar30,TVar30)),0);
      uVar37 = auVar38._0_4_;
      *(undefined4 *)mbmi_00->inter_tx_size = uVar37;
      *(undefined4 *)(mbmi_00->inter_tx_size + 4) = uVar37;
      *(undefined4 *)(mbmi_00->inter_tx_size + 8) = uVar37;
      *(undefined4 *)(mbmi_00->inter_tx_size + 0xc) = uVar37;
    }
    bVar2 = (td->dcb).xd.width;
    bVar18 = (td->dcb).xd.height;
    if (mbmi_00->skip_txfm == '\0') {
      uVar20 = (uint)*(byte *)(tx_size_high + uVar29);
      bVar13 = true;
    }
    else if ((mbmi_00->field_0xa7 & 0x80) == 0) {
      bVar13 = mbmi_00->ref_frame[0] < '\x01';
      if (mbmi_00->ref_frame[0] < '\x01') {
        uVar20 = tx_size_high[uVar29];
      }
      else {
        uVar20 = (uint)bVar18 * 4 & 0xff;
      }
    }
    else {
      uVar20 = (uint)bVar18 * 4;
      bVar13 = false;
    }
    if ((ulong)bVar2 != 0) {
      if (bVar13) {
        uVar26 = tx_size_wide[uVar29];
      }
      else {
        uVar26 = (uint)bVar2 * 4 & 0xff;
      }
      memset((td->dcb).xd.above_txfm_context,uVar26,(ulong)bVar2);
    }
    if ((ulong)bVar18 != 0) {
      memset((td->dcb).xd.left_txfm_context,uVar20 & 0xff,(ulong)bVar18);
    }
  }
  else {
    bVar23 = ""[uVar29];
    iVar32 = tx_size_high_unit[bVar23];
    iVar16 = tx_size_wide_unit[bVar23];
    iVar31 = 0;
    do {
      iVar36 = 0;
      do {
        read_tx_size_vartx((MACROBLOCKD *)td,mbmi_00,bVar23,0,iVar31,iVar36,r);
        iVar36 = iVar36 + iVar16;
      } while (iVar36 < (int)(uint)bVar2);
      iVar31 = iVar31 + iVar32;
      local_70 = (uint)bVar18;
    } while (iVar31 < (int)local_70);
  }
  uVar20 = (uint)(uVar3 == '\0') * 2 + 1;
  if ((pbi->common).delta_q_info.delta_q_present_flag != 0) {
    piVar34 = (td->dcb).xd.plane[0].seg_dequant_QTX[0] + 1;
    lVar21 = 0;
    do {
      iVar32 = av1_get_qindex(&(pbi->common).seg,(int)lVar21,(td->dcb).xd.current_base_qindex);
      uVar29 = 0;
      piVar35 = piVar34;
      do {
        if ((int)uVar29 == 1) {
          iVar16 = (pbi->common).quant_params.u_ac_delta_q;
          piVar17 = &(pbi->common).quant_params.u_dc_delta_q;
        }
        else if ((int)uVar29 == 0) {
          iVar16 = 0;
          piVar17 = &(pbi->common).quant_params.y_dc_delta_q;
        }
        else {
          iVar16 = (pbi->common).quant_params.v_ac_delta_q;
          piVar17 = &(pbi->common).quant_params.v_dc_delta_q;
        }
        iVar15 = av1_dc_quant_QTX(iVar32,*piVar17,((pbi->common).seq_params)->bit_depth);
        (*(int16_t (*) [2])(piVar35 + -1))[0] = iVar15;
        iVar15 = av1_ac_quant_QTX(iVar32,iVar16,((pbi->common).seq_params)->bit_depth);
        *piVar35 = iVar15;
        uVar29 = uVar29 + 1;
        piVar35 = piVar35 + 0x518;
      } while (uVar20 != uVar29);
      lVar21 = lVar21 + 1;
      piVar34 = piVar34 + 2;
    } while (lVar21 != 8);
  }
  if (mbmi_00->skip_txfm != '\0') {
    av1_reset_entropy_context((MACROBLOCKD *)td,bsize,uVar20);
  }
  decode_token_recon_block(pbi,td,r,bsize);
  return;
}

Assistant:

static inline void parse_decode_block(AV1Decoder *const pbi,
                                      ThreadData *const td, int mi_row,
                                      int mi_col, aom_reader *r,
                                      PARTITION_TYPE partition,
                                      BLOCK_SIZE bsize) {
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  decode_mbmi_block(pbi, dcb, mi_row, mi_col, r, partition, bsize);

  av1_visit_palette(pbi, xd, r, av1_decode_palette_tokens);

  AV1_COMMON *cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  int inter_block_tx = is_inter_block(mbmi) || is_intrabc_block(mbmi);
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !mbmi->skip_txfm && inter_block_tx && !xd->lossless[mbmi->segment_id]) {
    const TX_SIZE max_tx_size = max_txsize_rect_lookup[bsize];
    const int bh = tx_size_high_unit[max_tx_size];
    const int bw = tx_size_wide_unit[max_tx_size];
    const int width = mi_size_wide[bsize];
    const int height = mi_size_high[bsize];

    for (int idy = 0; idy < height; idy += bh)
      for (int idx = 0; idx < width; idx += bw)
        read_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, r);
  } else {
    mbmi->tx_size = read_tx_size(xd, cm->features.tx_mode, inter_block_tx,
                                 !mbmi->skip_txfm, r);
    if (inter_block_tx)
      memset(mbmi->inter_tx_size, mbmi->tx_size, sizeof(mbmi->inter_tx_size));
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  mbmi->skip_txfm && is_inter_block(mbmi), xd);
  }

  if (cm->delta_q_info.delta_q_present_flag) {
    for (int i = 0; i < MAX_SEGMENTS; i++) {
      const int current_qindex =
          av1_get_qindex(&cm->seg, i, xd->current_base_qindex);
      const CommonQuantParams *const quant_params = &cm->quant_params;
      for (int j = 0; j < num_planes; ++j) {
        const int dc_delta_q = j == 0 ? quant_params->y_dc_delta_q
                                      : (j == 1 ? quant_params->u_dc_delta_q
                                                : quant_params->v_dc_delta_q);
        const int ac_delta_q = j == 0 ? 0
                                      : (j == 1 ? quant_params->u_ac_delta_q
                                                : quant_params->v_ac_delta_q);
        xd->plane[j].seg_dequant_QTX[i][0] = av1_dc_quant_QTX(
            current_qindex, dc_delta_q, cm->seq_params->bit_depth);
        xd->plane[j].seg_dequant_QTX[i][1] = av1_ac_quant_QTX(
            current_qindex, ac_delta_q, cm->seq_params->bit_depth);
      }
    }
  }
  if (mbmi->skip_txfm) av1_reset_entropy_context(xd, bsize, num_planes);

  decode_token_recon_block(pbi, td, r, bsize);
}